

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O0

CURLcode gzip_do_init(Curl_easy *data,Curl_cwriter *writer)

{
  int iVar1;
  z_stream *z;
  zlib_writer *zp;
  Curl_cwriter *writer_local;
  Curl_easy *data_local;
  
  writer[0x203].next = (Curl_cwriter *)zalloc_cb;
  writer[0x203].ctx = zfree_cb;
  iVar1 = inflateInit2_(&writer[0x201].next,0x2f,"1.2.11",0x70);
  if (iVar1 == 0) {
    *(undefined4 *)&writer[1].cwt = 4;
    data_local._4_4_ = CURLE_OK;
  }
  else {
    data_local._4_4_ = process_zlib_error(data,(z_stream *)&writer[0x201].next);
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode gzip_do_init(struct Curl_easy *data,
                             struct Curl_cwriter *writer)
{
  struct zlib_writer *zp = (struct zlib_writer *) writer;
  z_stream *z = &zp->z;     /* zlib state structure */

  /* Initialize zlib */
  z->zalloc = (alloc_func) zalloc_cb;
  z->zfree = (free_func) zfree_cb;

  if(inflateInit2(z, MAX_WBITS + 32) != Z_OK)
    return process_zlib_error(data, z);

  zp->zlib_init = ZLIB_INIT_GZIP; /* Transparent gzip decompress state */
  return CURLE_OK;
}